

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceDefaultInstance
          (FileGenerator *this,int idx,Printer *printer)

{
  Options *descriptor;
  string *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MessageGenerator *this_00;
  Options *pOVar2;
  Formatter format;
  string local_a8;
  Formatter local_88;
  string local_50;
  
  local_88.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_88.vars_._M_t,&(this->variables_)._M_t);
  pOVar2 = (Options *)
           (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (MessageGenerator *)(&(pOVar2->dllexport_decl)._M_dataplus)[idx]._M_p;
  descriptor = &this->options_;
  DefaultInstanceType_abi_cxx11_
            (&local_a8,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar2);
  args_1 = &this_00->classname_;
  pOVar2 = (Options *)args_1;
  Formatter::operator()
            (&local_88,
             "class $1$ {\n public:\n  ::$proto_ns$::internal::ExplicitlyConstructed<$2$> _instance;\n"
             ,&local_a8,args_1);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  io::Printer::Indent(local_88.printer_);
  MessageGenerator::GenerateExtraDefaultFields(this_00,printer);
  io::Printer::Outdent(local_88.printer_);
  DefaultInstanceName_abi_cxx11_
            (&local_a8,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar2);
  Formatter::operator()(&local_88,"} $1$;\n",&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((this->options_).lite_implicit_weak_fields == true) {
    DefaultInstancePtr_abi_cxx11_
              (&local_a8,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar2);
    DefaultInstanceName_abi_cxx11_
              (&local_50,(cpp *)this_00->descriptor_,(Descriptor *)descriptor,pOVar2);
    Formatter::operator()
              (&local_88,"$1$DefaultTypeInternal* $2$ = &$3$;\n",args_1,&local_a8,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_88.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSourceDefaultInstance(int idx,
                                                  io::Printer* printer) {
  Formatter format(printer, variables_);
  MessageGenerator* generator = message_generators_[idx].get();
  format(
      "class $1$ {\n"
      " public:\n"
      "  ::$proto_ns$::internal::ExplicitlyConstructed<$2$> _instance;\n",
      DefaultInstanceType(generator->descriptor_, options_),
      generator->classname_);
  format.Indent();
  generator->GenerateExtraDefaultFields(printer);
  format.Outdent();
  format("} $1$;\n", DefaultInstanceName(generator->descriptor_, options_));
  if (options_.lite_implicit_weak_fields) {
    format("$1$DefaultTypeInternal* $2$ = &$3$;\n", generator->classname_,
           DefaultInstancePtr(generator->descriptor_, options_),
           DefaultInstanceName(generator->descriptor_, options_));
  }
}